

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_read_compressed_img
              (fitsfile *fptr,int datatype,LONGLONG *infpixel,LONGLONG *inlpixel,long *ininc,
              int nullcheck,void *nullval,void *array,char *nullarray,int *anynul,int *status)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  size_t __size;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  FITSfile *pFVar9;
  long lVar10;
  double dVar11;
  int local_39c;
  char *local_398;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  char *local_380;
  int local_370;
  int tilenul;
  ulong local_368;
  fitsfile *local_360;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  ulong local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long tlpixel [6];
  long tfpixel [6];
  long ltile [6];
  long ftile [6];
  long tilesize [6];
  long naxis [6];
  long rowdim [6];
  long inc [6];
  long lpixel [6];
  long fpixel [6];
  
  tilenul = 0;
  if (0 < *status) {
    return *status;
  }
  uVar8 = (ulong)(uint)datatype;
  local_360 = fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
    *status = 0x19e;
    return 0x19e;
  }
  local_39c = 2;
  local_240 = uVar8;
  if (datatype == 0x14) {
    pFVar9 = local_360->Fptr;
    __size = pFVar9->maxtilelen;
    local_398 = (char *)malloc(__size * 2);
    if (nullval != (void *)0x0) {
      uVar2 = (uint)*nullval;
      goto LAB_001c4c7f;
    }
    goto LAB_001c4c85;
  }
  if (datatype == 0x52) {
    pFVar9 = local_360->Fptr;
    __size = pFVar9->maxtilelen;
    local_398 = (char *)malloc(__size * 8);
    if (nullval == (void *)0x0) goto LAB_001c4bfb;
    dVar11 = *nullval;
    goto LAB_001c4bff;
  }
  if (datatype == 0x1e) {
    pFVar9 = local_360->Fptr;
    __size = pFVar9->maxtilelen;
    local_398 = (char *)malloc(__size * 4);
    if (nullval == (void *)0x0) {
LAB_001c4c34:
      dVar11 = 0.0;
    }
    else {
      dVar11 = (double)*nullval;
    }
LAB_001c4c38:
    local_39c = 4;
  }
  else {
    if (datatype == 0x1f) {
      pFVar9 = local_360->Fptr;
      __size = pFVar9->maxtilelen;
      local_398 = (char *)malloc(__size * 4);
      if (nullval == (void *)0x0) goto LAB_001c4c34;
      dVar11 = (double)*nullval;
      goto LAB_001c4c38;
    }
    if (datatype == 0x28) {
      pFVar9 = local_360->Fptr;
      __size = pFVar9->maxtilelen;
      local_398 = (char *)malloc(__size * 8);
      if (nullval == (void *)0x0) {
LAB_001c4bfb:
        dVar11 = 0.0;
      }
      else {
        dVar11 = ((double)CONCAT44(0x45300000,(int)((ulong)*nullval >> 0x20)) -
                 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*nullval) - 4503599627370496.0);
      }
LAB_001c4bff:
      local_39c = 8;
    }
    else {
      if (datatype == 0x29) {
        pFVar9 = local_360->Fptr;
        __size = pFVar9->maxtilelen;
        local_398 = (char *)malloc(__size * 8);
        if (nullval == (void *)0x0) goto LAB_001c4bfb;
        dVar11 = (double)*nullval;
        goto LAB_001c4bff;
      }
      if (datatype == 0x2a) {
        pFVar9 = local_360->Fptr;
        __size = pFVar9->maxtilelen;
        local_398 = (char *)malloc(__size * 4);
        if (nullval == (void *)0x0) goto LAB_001c4c34;
        dVar11 = (double)*nullval;
        goto LAB_001c4c38;
      }
      if (datatype == 0x15) {
        pFVar9 = local_360->Fptr;
        __size = pFVar9->maxtilelen;
        local_398 = (char *)malloc(__size * 2);
        local_39c = 2;
        if (nullval == (void *)0x0) goto LAB_001c4c85;
        uVar2 = (uint)*nullval;
LAB_001c4c7f:
        dVar11 = (double)(int)uVar2;
      }
      else {
        if (1 < datatype - 0xbU) {
          ffpmsg("unsupported datatype for uncompressing image");
          *status = 0x19a;
          return 0x19a;
        }
        pFVar9 = local_360->Fptr;
        __size = pFVar9->maxtilelen;
        local_398 = (char *)malloc(__size);
        local_39c = 1;
        if (nullval != (void *)0x0) {
          uVar2 = (uint)*nullval;
          goto LAB_001c4c7f;
        }
LAB_001c4c85:
        dVar11 = 0.0;
      }
    }
  }
  uVar2 = 0;
  if (dVar11 != 0.0) {
    uVar2 = nullcheck;
  }
  local_368 = (ulong)uVar2;
  if (NAN(dVar11)) {
    local_368 = (ulong)(uint)nullcheck;
  }
  if (nullcheck != 1) {
    local_368 = (ulong)(uint)nullcheck;
  }
  if (local_398 == (char *)0x0) {
    ffpmsg("Out of memory (fits_read_compress_img)");
LAB_001c4cee:
    *status = 0x71;
    iVar1 = 0x71;
  }
  else {
    if ((int)local_368 == 2) {
      local_380 = (char *)calloc(__size,1);
      if (local_380 == (char *)0x0) {
        ffpmsg("Out of memory (fits_read_compress_img)");
        free(local_398);
        goto LAB_001c4cee;
      }
    }
    else {
      local_380 = (char *)0x0;
    }
    lVar7 = 1;
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      naxis[lVar3] = 1;
      tilesize[lVar3] = 1;
      ftile[lVar3] = 1;
      ltile[lVar3] = 1;
      rowdim[lVar3] = 1;
    }
    uVar2 = pFVar9->zndim;
    lVar3 = 0;
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    for (; uVar8 * 8 != lVar3; lVar3 = lVar3 + 8) {
      lVar4 = *(long *)((long)infpixel + lVar3);
      lVar6 = *(long *)((long)inlpixel + lVar3);
      lVar5 = -*(long *)((long)ininc + lVar3);
      lVar10 = lVar6;
      if (lVar4 < lVar6) {
        lVar10 = lVar4;
      }
      if (lVar4 <= lVar6) {
        lVar5 = *(long *)((long)ininc + lVar3);
        lVar4 = lVar6;
      }
      *(long *)((long)fpixel + lVar3) = lVar10;
      *(long *)((long)lpixel + lVar3) = lVar4;
      *(long *)((long)inc + lVar3) = lVar5;
      lVar6 = *(long *)((long)pFVar9->znaxis + lVar3);
      *(long *)((long)naxis + lVar3) = lVar6;
      if (lVar10 < 1) {
        if ((int)local_368 == 2) {
          free(local_380);
        }
        free(local_398);
        *status = 0x141;
        return 0x141;
      }
      lVar5 = *(long *)((long)pFVar9->tilesize + lVar3);
      *(long *)((long)tilesize + lVar3) = lVar5;
      lVar6 = (lVar6 + -1) / lVar5 + 1;
      *(long *)((long)ftile + lVar3) = (lVar10 + -1) / lVar5 + 1;
      lVar4 = (lVar4 + -1) / lVar5 + 1;
      if (lVar6 <= lVar4) {
        lVar4 = lVar6;
      }
      *(long *)((long)ltile + lVar3) = lVar4;
      *(long *)((long)rowdim + lVar3) = lVar7;
      lVar7 = lVar7 * lVar6;
    }
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    local_358 = (int)rowdim[5];
    local_330 = ftile[4];
    local_354 = (int)rowdim[4];
    local_308 = ftile[3];
    local_350 = (int)rowdim[3];
    local_2d8 = ftile[2];
    local_34c = (int)rowdim[2];
    local_268 = ftile[0] * tilesize[0];
    local_2a8 = ftile[1];
    local_348 = (int)rowdim[1];
    local_390 = ((int)ftile[2] + -1) * (int)rowdim[2] + ((int)ftile[3] + -1) * (int)rowdim[3] +
                ((int)ftile[4] + -1) * (int)rowdim[4] + ((int)ftile[5] + -1) * (int)rowdim[5] +
                ((int)ftile[1] + -1) * (int)rowdim[1] + (int)ftile[0];
    local_260 = ftile[0];
    local_228 = tilesize[0];
    local_270 = (ftile[0] + -1) * tilesize[0];
    local_278 = -local_270;
    local_270 = local_270 + 1;
    local_328 = ltile[5];
    local_338 = tilesize[5];
    local_340 = naxis[5];
    local_2f8 = ltile[4];
    local_310 = tilesize[4];
    local_318 = naxis[4];
    local_2c8 = ltile[3];
    local_2e0 = tilesize[3];
    local_2e8 = naxis[3];
    local_298 = ltile[2];
    local_2b0 = tilesize[2];
    local_2b8 = naxis[2];
    local_220 = ltile[0];
    local_250 = ltile[1];
    local_280 = tilesize[1];
    local_288 = naxis[1];
    local_230 = naxis[0];
    while (ftile[5] <= local_328) {
      local_300 = (ftile[5] + -1) * local_338;
      tfpixel[5] = local_300 + 1;
      tlpixel[5] = local_338 * ftile[5];
      if (local_340 <= local_338 * ftile[5]) {
        tlpixel[5] = local_340;
      }
      local_300 = tlpixel[5] - local_300;
      local_38c = local_390;
      lVar7 = local_330;
      local_320 = ftile[5];
      while (lVar7 <= local_2f8) {
        lVar3 = (lVar7 + -1) * local_310;
        tfpixel[4] = lVar3 + 1;
        tlpixel[4] = local_310 * lVar7;
        if (local_318 <= local_310 * lVar7) {
          tlpixel[4] = local_318;
        }
        local_2d0 = (tlpixel[4] - lVar3) * local_300;
        local_388 = local_38c;
        lVar3 = local_308;
        local_2f0 = lVar7;
        while (lVar3 <= local_2c8) {
          lVar7 = (lVar3 + -1) * local_2e0;
          tfpixel[3] = lVar7 + 1;
          tlpixel[3] = local_2e0 * lVar3;
          if (local_2e8 <= local_2e0 * lVar3) {
            tlpixel[3] = local_2e8;
          }
          local_2a0 = (tlpixel[3] - lVar7) * local_2d0;
          local_384 = local_388;
          lVar7 = local_2d8;
          local_2c0 = lVar3;
          while (lVar7 <= local_298) {
            lVar3 = (lVar7 + -1) * local_2b0;
            tfpixel[2] = lVar3 + 1;
            tlpixel[2] = local_2b0 * lVar7;
            if (local_2b8 <= local_2b0 * lVar7) {
              tlpixel[2] = local_2b8;
            }
            local_258 = (tlpixel[2] - lVar3) * local_2a0;
            lVar3 = local_2a8;
            local_370 = local_384;
            local_290 = lVar7;
            while (lVar3 <= local_250) {
              lVar7 = (lVar3 + -1) * local_280;
              tfpixel[1] = lVar7 + 1;
              tlpixel[1] = local_280 * lVar3;
              if (local_288 <= local_280 * lVar3) {
                tlpixel[1] = local_288;
              }
              local_238 = (tlpixel[1] - lVar7) * local_258;
              lVar7 = local_270;
              lVar4 = local_268;
              lVar6 = local_260;
              lVar10 = local_278;
              local_344 = local_370;
              local_248 = lVar3;
              while( true ) {
                lVar3 = lVar4;
                if (naxis[0] < lVar4) {
                  lVar3 = naxis[0];
                }
                if (local_220 < lVar6) break;
                tlpixel[0] = naxis[0];
                if (lVar4 < naxis[0]) {
                  tlpixel[0] = lVar4;
                }
                tfpixel[0] = lVar7;
                iVar1 = imcomp_test_overlap(uVar2,tfpixel,tlpixel,fpixel,lpixel,inc,status);
                if (iVar1 != 0) {
                  iVar1 = (int)local_368;
                  imcomp_decompress_tile
                            (local_360,local_370,((int)lVar3 + (int)lVar10) * (int)local_238,
                             (int)local_240,iVar1,nullval,local_398,local_380,&tilenul,status);
                  if ((anynul != (int *)0x0) && (tilenul != 0)) {
                    *anynul = 1;
                  }
                  imcomp_copy_overlap(local_398,local_39c,uVar2,tfpixel,tlpixel,local_380,
                                      (char *)array,fpixel,lpixel,inc,iVar1,nullarray,status);
                }
                lVar6 = lVar6 + 1;
                lVar4 = lVar4 + local_228;
                lVar10 = lVar10 - local_228;
                lVar7 = lVar7 + local_228;
                local_370 = local_370 + 1;
                naxis[0] = local_230;
              }
              local_370 = local_344 + local_348;
              lVar3 = local_248 + 1;
            }
            local_384 = local_384 + local_34c;
            lVar7 = local_290 + 1;
          }
          local_388 = local_388 + local_350;
          lVar3 = local_2c0 + 1;
        }
        local_38c = local_38c + local_354;
        lVar7 = local_2f0 + 1;
      }
      local_390 = local_390 + local_358;
      ftile[5] = local_320 + 1;
    }
    if ((int)local_368 == 2) {
      free(local_380);
    }
    free(local_398);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fits_read_compressed_img(fitsfile *fptr,   /* I - FITS file pointer      */
            int  datatype,  /* I - datatype of the array to be returned      */
            LONGLONG  *infpixel, /* I - 'bottom left corner' of the subsection    */
            LONGLONG  *inlpixel, /* I - 'top right corner' of the subsection      */
            long  *ininc,    /* I - increment to be applied in each dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
   Read a section of a compressed image;  Note: lpixel may be larger than the 
   size of the uncompressed image.  Only the pixels within the image will be
   returned.
*/
{
    long naxis[MAX_COMPRESS_DIM], tiledim[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow;
    int ii, ndim, pixlen, tilenul=0;
    void *buffer;
    char *bnullarray = 0;
    double testnullval = 0.;

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* get temporary space for uncompressing one image tile */
    if (datatype == TSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (short)); 
       pixlen = sizeof(short);
       if (nullval)
           testnullval = *(short *) nullval;
    }
    else if (datatype == TINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (int));
       pixlen = sizeof(int);
       if (nullval)
           testnullval = *(int *) nullval;
    }
    else if (datatype == TLONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (long));
       pixlen = sizeof(long);
       if (nullval)
           testnullval = *(long *) nullval;
    }
    else if (datatype == TFLOAT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (float));
       pixlen = sizeof(float);
       if (nullval)
           testnullval = *(float *) nullval;
    }
    else if (datatype == TDOUBLE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (double));
       pixlen = sizeof(double);
       if (nullval)
           testnullval = *(double *) nullval;
    }
    else if (datatype == TUSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned short));
       pixlen = sizeof(short);
       if (nullval)
           testnullval = *(unsigned short *) nullval;
    }
    else if (datatype == TUINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned int));
       pixlen = sizeof(int);
       if (nullval)
           testnullval = *(unsigned int *) nullval;
    }
    else if (datatype == TULONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned long));
       pixlen = sizeof(long);
       if (nullval)
           testnullval = *(unsigned long *) nullval;
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (char));
       pixlen = 1;
       if (nullval)
           testnullval = *(unsigned char *) nullval;
    }
    else
    {
        ffpmsg("unsupported datatype for uncompressing image");
        return(*status = BAD_DATATYPE);
    }

    /* If nullcheck ==1 and nullval == 0, then this means that the */
    /* calling routine does not want to check for null pixels in the array */
    if (nullcheck == 1 && testnullval == 0.)
        nullcheck = 0;

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_read_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }
	
    /* allocate memory for a null flag array, if needed */
    if (nullcheck == 2)
    {
        bnullarray = calloc ((fptr->Fptr)->maxtilelen, sizeof (char));

        if (bnullarray == NULL)
        {
	    ffpmsg("Out of memory (fits_read_compress_img)");
            free(buffer);
	    return (*status = MEMORY_ALLOCATION);
        }
    }

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        /* support for mirror-reversed image sections */
        if (infpixel[ii] <= inlpixel[ii])
        {
           fpixel[ii] = (long) infpixel[ii];
           lpixel[ii] = (long) inlpixel[ii];
           inc[ii]    = ininc[ii];
        }
        else
        {
           fpixel[ii] = (long) inlpixel[ii];
           lpixel[ii] = (long) infpixel[ii];
           inc[ii]    = -ininc[ii];
        }

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            if (nullcheck == 2)
            {
                free(bnullarray);
            }
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    if (anynul)
       *anynul = 0;  /* initialize */

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
             tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
             tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];

/*
printf("row %d, %d %d, %d %d, %d %d; %d\n",
              irow, tfpixel[0],tlpixel[0],tfpixel[1],tlpixel[1],tfpixel[2],tlpixel[2],
	      thistilesize[0]);
*/   
              /* test if there are any intersecting pixels in this tile and the output image */
              if (imcomp_test_overlap(ndim, tfpixel, tlpixel, 
                      fpixel, lpixel, inc, status)) {
                  /* read and uncompress this row (tile) of the table */
                  /* also do type conversion and undefined pixel substitution */
                  /* at this point */

                  imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

                  if (tilenul && anynul)
                      *anynul = 1;  /* there are null pixels */
/*
printf(" pixlen=%d, ndim=%d, %d %d %d, %d %d %d, %d %d %d\n",
     pixlen, ndim, fpixel[0],lpixel[0],inc[0],fpixel[1],lpixel[1],inc[1],
     fpixel[2],lpixel[2],inc[2]);
*/
                  /* copy the intersecting pixels from this tile to the output */
                  imcomp_copy_overlap(buffer, pixlen, ndim, tfpixel, tlpixel, 
                     bnullarray, array, fpixel, lpixel, inc, nullcheck, 
                     nullarray, status);
               }
            }
          }
        }
      }
     }
    }
    if (nullcheck == 2)
    {
        free(bnullarray);
    }
    free(buffer);

    return(*status);
}